

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent_inlines.h
# Opt level: O0

arena_t * extent_arena_get(extent_t *extent)

{
  uint uVar1;
  extent_t *in_RDI;
  uint arena_ind;
  void *result;
  
  uVar1 = extent_arena_ind_get(in_RDI);
  return (arena_t *)arenas[uVar1].repr;
}

Assistant:

static inline arena_t *
extent_arena_get(const extent_t *extent) {
	unsigned arena_ind = extent_arena_ind_get(extent);

	return (arena_t *)atomic_load_p(&arenas[arena_ind], ATOMIC_ACQUIRE);
}